

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

double GuessVerificationProgress(ChainTxData *data,CBlockIndex *pindex)

{
  long lVar1;
  bool *pbVar2;
  double *pdVar3;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  double fTxTotal;
  int64_t nNow;
  Level in_stack_000000a0;
  int *in_stack_000000b0;
  char (*in_stack_000000b8) [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000c0;
  char (*in_stack_000000c8) [42];
  undefined4 in_stack_fffffffffffffef8;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffefc;
  double *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff18;
  LogFlags in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  int source_line;
  double local_68;
  ConstevalFormatString<4U> in_stack_ffffffffffffffa8;
  string_view in_stack_ffffffffffffffb0;
  string_view in_stack_ffffffffffffffc0;
  
  source_line = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == 0) {
    local_68 = 0.0;
  }
  else {
    pbVar2 = inline_assertion_check<false,bool>
                       ((bool *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                        (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                        (char *)in_stack_ffffffffffffff00,
                        (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    if (((*pbVar2 ^ 0xffU) & 1) == 0) {
      time((time_t *)0x0);
      if (*(ulong *)(in_RDI + 8) < *(ulong *)(in_RSI + 0x50)) {
        CBlockIndex::GetBlockTime
                  ((CBlockIndex *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      }
      pdVar3 = std::min<double>(in_stack_ffffffffffffff00,
                                (double *)
                                CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      local_68 = *pdVar3;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      FormatFullVersion_abi_cxx11_();
      uVar4 = 3;
      LogPrintFormatInternal<int,char[13],std::__cxx11::string,char[42]>
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb0,source_line,
                 in_stack_ffffffffffffff60,in_stack_000000a0,in_stack_ffffffffffffffa8,
                 in_stack_000000b0,in_stack_000000b8,in_stack_000000c0,in_stack_000000c8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffefc,uVar4));
      local_68 = 0.0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_68;
}

Assistant:

double GuessVerificationProgress(const ChainTxData& data, const CBlockIndex *pindex) {
    if (pindex == nullptr)
        return 0.0;

    if (!Assume(pindex->m_chain_tx_count > 0)) {
        LogWarning("Internal bug detected: block %d has unset m_chain_tx_count (%s %s). Please report this issue here: %s\n",
                   pindex->nHeight, PACKAGE_NAME, FormatFullVersion(), PACKAGE_BUGREPORT);
        return 0.0;
    }

    int64_t nNow = time(nullptr);

    double fTxTotal;

    if (pindex->m_chain_tx_count <= data.tx_count) {
        fTxTotal = data.tx_count + (nNow - data.nTime) * data.dTxRate;
    } else {
        fTxTotal = pindex->m_chain_tx_count + (nNow - pindex->GetBlockTime()) * data.dTxRate;
    }

    return std::min<double>(pindex->m_chain_tx_count / fTxTotal, 1.0);
}